

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

uint __thiscall TxConfirmStats::NewTx(TxConfirmStats *this,uint nBlockHeight,double val)

{
  int *piVar1;
  uint uVar2;
  pointer pvVar3;
  const_iterator cVar4;
  long in_FS_OFFSET;
  double val_local;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  val_local = val;
  cVar4 = std::
          _Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
          ::lower_bound(&this->bucketMap->_M_t,&val_local);
  uVar2 = *(uint *)&cVar4._M_node[1]._M_parent;
  pvVar3 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar1 = (int *)(*(long *)&pvVar3[(ulong)nBlockHeight %
                                    (ulong)(((long)(this->unconfTxs).
                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pvVar3) / 0x18)].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)uVar2 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int TxConfirmStats::NewTx(unsigned int nBlockHeight, double val)
{
    unsigned int bucketindex = bucketMap.lower_bound(val)->second;
    unsigned int blockIndex = nBlockHeight % unconfTxs.size();
    unconfTxs[blockIndex][bucketindex]++;
    return bucketindex;
}